

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

void * sk_getxdmdata(Socket *sock,int *lenp)

{
  uint value;
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  __pid_t _Var4;
  bool bVar5;
  in6_addr *__a;
  char *buf;
  undefined1 local_a8 [4];
  socklen_t addrlen;
  sockaddr_union u;
  NetSocket *s;
  int *lenp_local;
  Socket *sock_local;
  
  if (sock->vt == &NetSocket_sockvt) {
    u.storage.__ss_align = (unsigned_long)(sock + -0x12);
    buf._4_4_ = 0x80;
    s = (NetSocket *)lenp;
    lenp_local = (int *)sock;
    iVar2 = getsockname(*(int *)&sock[-0x11].vt,(sockaddr *)local_a8,(socklen_t *)((long)&buf + 4));
    if (iVar2 < 0) {
      sock_local = (Socket *)0x0;
    }
    else {
      if (local_a8._0_2_ == 1) {
        *(undefined4 *)&s->error = 6;
        __a = (in6_addr *)safemalloc((long)*(int *)&s->error,1,0);
        value = sk_getxdmdata::unix_addr;
        sk_getxdmdata::unix_addr = sk_getxdmdata::unix_addr - 1;
        PUT_32BIT_MSB_FIRST(__a,value);
        _Var4 = getpid();
        PUT_16BIT_MSB_FIRST((void *)((long)&__a->__in6_u + 4),(uint16_t)_Var4);
      }
      else if (local_a8._0_2_ == 2) {
        *(undefined4 *)&s->error = 6;
        __a = (in6_addr *)safemalloc((long)*(int *)&s->error,1,0);
        uVar3 = ntohl(addrlen);
        PUT_32BIT_MSB_FIRST(__a,uVar3);
        uVar1 = ntohs(local_a8._2_2_);
        PUT_16BIT_MSB_FIRST((void *)((long)&__a->__in6_u + 4),uVar1);
      }
      else {
        if (local_a8._0_2_ != 10) {
          return (void *)0x0;
        }
        *(undefined4 *)&s->error = 6;
        __a = (in6_addr *)safemalloc((long)*(int *)&s->error,1,0);
        bVar5 = false;
        if ((u._0_4_ == 0) && (bVar5 = false, u.sin6.sin6_flowinfo == 0)) {
          uVar3 = htonl(0xffff);
          bVar5 = u._8_4_ == uVar3;
        }
        if (bVar5) {
          (__a->__in6_u).__u6_addr32[0] = u._12_4_;
          uVar1 = ntohs(local_a8._2_2_);
          PUT_16BIT_MSB_FIRST((void *)((long)&__a->__in6_u + 4),uVar1);
        }
        else {
          memset(__a,0,6);
        }
      }
      sock_local = (Socket *)__a;
    }
  }
  else {
    sock_local = (Socket *)0x0;
  }
  return sock_local;
}

Assistant:

void *sk_getxdmdata(Socket *sock, int *lenp)
{
    NetSocket *s;
    union sockaddr_union u;
    socklen_t addrlen;
    char *buf;
    static unsigned int unix_addr = 0xFFFFFFFF;

    /*
     * We must check that this socket really _is_ a NetSocket before
     * downcasting it.
     */
    if (sock->vt != &NetSocket_sockvt)
        return NULL;                   /* failure */
    s = container_of(sock, NetSocket, sock);

    addrlen = sizeof(u);
    if (getsockname(s->s, &u.sa, &addrlen) < 0)
        return NULL;
    switch(u.sa.sa_family) {
      case AF_INET:
        *lenp = 6;
        buf = snewn(*lenp, char);
        PUT_32BIT_MSB_FIRST(buf, ntohl(u.sin.sin_addr.s_addr));
        PUT_16BIT_MSB_FIRST(buf+4, ntohs(u.sin.sin_port));
        break;
#ifndef NO_IPV6
    case AF_INET6:
        *lenp = 6;
        buf = snewn(*lenp, char);
        if (IN6_IS_ADDR_V4MAPPED(&u.sin6.sin6_addr)) {
            memcpy(buf, u.sin6.sin6_addr.s6_addr + 12, 4);
            PUT_16BIT_MSB_FIRST(buf+4, ntohs(u.sin6.sin6_port));
        } else
            /* This is stupid, but it's what XLib does. */
            memset(buf, 0, 6);
        break;
#endif
      case AF_UNIX:
        *lenp = 6;
        buf = snewn(*lenp, char);
        PUT_32BIT_MSB_FIRST(buf, unix_addr--);
        PUT_16BIT_MSB_FIRST(buf+4, getpid());
        break;

        /* XXX IPV6 */

      default:
        return NULL;
    }

    return buf;
}